

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_add(roaring_bitmap_t *r,uint32_t val)

{
  uint8_t typecode;
  ushort uVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  undefined8 in_RAX;
  shared_container_t *sc;
  container_t *pcVar4;
  array_container_t *c;
  container_t *pcVar5;
  void **ppvVar6;
  ushort key;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint8_t newtypecode;
  undefined8 uStack_38;
  
  iVar8 = (r->high_low_container).size;
  key = (ushort)(val >> 0x10);
  uStack_38 = in_RAX;
  if (((long)iVar8 == 0) || (puVar2 = (r->high_low_container).keys, puVar2[(long)iVar8 + -1] == key)
     ) {
    uVar7 = iVar8 - 1;
  }
  else {
    if (iVar8 < 1) {
      uVar7 = 0xffffffff;
      goto LAB_00102cf6;
    }
    iVar8 = iVar8 + -1;
    uVar9 = 0;
    do {
      uVar7 = iVar8 + uVar9 >> 1;
      uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar8 + uVar9 & 0xfffffffe));
      if (uVar1 < key) {
        uVar9 = uVar7 + 1;
      }
      else {
        if (uVar1 <= key) goto LAB_00102c1a;
        iVar8 = uVar7 - 1;
      }
    } while ((int)uVar9 <= iVar8);
    uVar7 = ~uVar9;
  }
  if (-1 < (int)uVar7) {
LAB_00102c1a:
    ppvVar6 = (r->high_low_container).containers;
    puVar3 = (r->high_low_container).typecodes;
    uVar9 = uVar7 & 0xffff;
    sc = (shared_container_t *)ppvVar6[uVar9];
    if (puVar3[uVar9] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar9);
      ppvVar6 = (r->high_low_container).containers;
    }
    *(shared_container_t **)((long)ppvVar6 + (ulong)(uVar9 * 8)) = sc;
    typecode = (r->high_low_container).typecodes[uVar9];
    pcVar5 = *(container_t **)((long)(r->high_low_container).containers + (ulong)(uVar9 * 8));
    uStack_38._0_7_ = CONCAT16(typecode,(undefined6)uStack_38);
    pcVar4 = container_add(pcVar5,(uint16_t)val,typecode,(uint8_t *)((long)&uStack_38 + 6));
    if (pcVar4 != pcVar5) {
      container_free(pcVar5,typecode);
      (r->high_low_container).containers[uVar7] = pcVar4;
      (r->high_low_container).typecodes[uVar7] = uStack_38._6_1_;
    }
    return;
  }
LAB_00102cf6:
  c = array_container_create();
  pcVar5 = container_add(c,(uint16_t)val,'\x02',(uint8_t *)((long)&uStack_38 + 7));
  ra_insert_new_key_value_at(&r->high_low_container,~uVar7,key,pcVar5,uStack_38._7_1_);
  return;
}

Assistant:

void roaring_bitmap_add(roaring_bitmap_t *r, uint32_t val) {
    roaring_array_t *ra = &r->high_low_container;

    const uint16_t hb = val >> 16;
    const int i = ra_get_index(ra, hb);
    uint8_t typecode;
    if (i >= 0) {
        ra_unshare_container_at_index(ra, (uint16_t)i);
        container_t *container =
            ra_get_container_at_index(ra, (uint16_t)i, &typecode);
        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_add(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }
    } else {
        array_container_t *newac = array_container_create();
        container_t *container =
            container_add(newac, val & 0xFFFF, ARRAY_CONTAINER_TYPE, &typecode);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(&r->high_low_container, -i - 1, hb,
                                   container, typecode);
    }
}